

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToUniSB::map(CCharmapToUniSB *this,char **outp,size_t *outlen,char *inp,size_t inlen)

{
  wchar_t ch;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (inlen == 0) {
    sVar2 = 0;
  }
  else {
    sVar4 = 0;
    sVar2 = 0;
    do {
      ch = *(wchar_t *)
            (&(this->super_CCharmapToUniSB_basic).field_0x20c + (ulong)(byte)inp[sVar4] * 4);
      uVar3 = (ulong)(ch < L'ࠀ') ^ 3;
      if (ch < L'\x80') {
        uVar3 = 1;
      }
      if (*outlen < uVar3) {
        sVar1 = 0;
      }
      else {
        sVar1 = utf8_ptr::s_putch(*outp,ch);
        *outp = *outp + sVar1;
        sVar1 = *outlen - uVar3;
      }
      sVar2 = sVar2 + uVar3;
      *outlen = sVar1;
      sVar4 = sVar4 + 1;
    } while (inlen != sVar4);
  }
  return sVar2;
}

Assistant:

size_t CCharmapToUniSB::map(char **outp, size_t *outlen,
                            const char *inp, size_t inlen) const
{
    size_t tot_outlen;

    /* we haven't written any characters to the output buffer yet */
    tot_outlen = 0;

    /* scan each character (character == byte) in the input string */
    for ( ; inlen > 0 ; --inlen, ++inp)
    {
        wchar_t uni;
        size_t csiz;
        
        /* get the unicode mapping for this character */
        uni = map_[(unsigned char)*inp];

        /* get the size of this character */
        csiz = utf8_ptr::s_wchar_size(uni);

        /* add it to the total output lenght */
        tot_outlen += csiz;

        /* if there's room, add it to our output buffer */
        if (*outlen >= csiz)
        {
            /* write it out */
            *outp += utf8_ptr::s_putch(*outp, uni);
            
            /* deduct it from the remaining output length */
            *outlen -= csiz;
        }
        else
        {
            /* there's no room - set the remaining output length to zero */
            *outlen = 0;
        }
    }

    /* return the total output length */
    return tot_outlen;
}